

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  size_t sVar1;
  size_t sVar2;
  char cVar3;
  undefined7 uVar4;
  ulong uVar5;
  byte bVar6;
  size_type sVar7;
  unsigned_long *puVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  reference this_00;
  size_t local_170;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  ulong local_a8;
  size_t pos;
  unsigned_long local_98;
  ulong local_90;
  size_t width;
  size_t tabPos;
  string remainder;
  size_t local_60;
  size_t indent;
  allocator local_41;
  string local_40 [8];
  string wrappableChars;
  TextAttributes *_attr_local;
  string *_str_local;
  Text *this_local;
  
  std::__cxx11::string::string((string *)this);
  sVar1 = _attr->initialIndent;
  sVar2 = _attr->indent;
  cVar3 = _attr->tabChar;
  uVar4 = *(undefined7 *)&_attr->field_0x19;
  (this->attr).width = _attr->width;
  (this->attr).tabChar = cVar3;
  *(undefined7 *)&(this->attr).field_0x19 = uVar4;
  (this->attr).initialIndent = sVar1;
  (this->attr).indent = sVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->lines);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40," [({.,/|\\-",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (_attr->initialIndent == 0xffffffffffffffff) {
    local_170 = _attr->indent;
  }
  else {
    local_170 = _attr->initialIndent;
  }
  local_60 = local_170;
  std::__cxx11::string::string((string *)&tabPos,(string *)_str);
  while( true ) {
    bVar6 = std::__cxx11::string::empty();
    if (((bVar6 ^ 0xff) & 1) == 0) {
      std::__cxx11::string::~string((string *)&tabPos);
      std::__cxx11::string::~string(local_40);
      return;
    }
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->lines);
    if (999 < sVar7) break;
    width = 0xffffffffffffffff;
    local_98 = std::__cxx11::string::size();
    pos = _attr->width - local_60;
    puVar8 = std::min<unsigned_long>(&local_98,&pos);
    local_90 = *puVar8;
    local_a8 = std::__cxx11::string::find_first_of((char)&tabPos,10);
    if (local_a8 <= local_90) {
      local_90 = local_a8;
    }
    local_a8 = std::__cxx11::string::find_last_of((char)&tabPos,(ulong)(uint)(int)_attr->tabChar);
    if (local_a8 != 0xffffffffffffffff) {
      width = local_a8;
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&tabPos);
      if (*pcVar9 == '\n') {
        local_90 = local_90 - 1;
      }
      std::__cxx11::string::substr((ulong)local_e8,(ulong)&tabPos);
      std::__cxx11::string::substr((ulong)local_108,(ulong)&tabPos);
      std::operator+(local_c8,local_e8);
      std::__cxx11::string::operator=((string *)&tabPos,(string *)local_c8);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string((string *)local_e8);
    }
    uVar5 = local_90;
    uVar10 = std::__cxx11::string::size();
    if (uVar5 == uVar10) {
      spliceLine(this,local_60,(string *)&tabPos,local_90);
    }
    else {
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&tabPos);
      if (*pcVar9 == '\n') {
        spliceLine(this,local_60,(string *)&tabPos,local_90);
        if ((local_90 < 2) || (lVar11 = std::__cxx11::string::size(), lVar11 != 1)) {
          std::__cxx11::string::substr((ulong)local_128,(ulong)&tabPos);
          std::__cxx11::string::operator=((string *)&tabPos,local_128);
          std::__cxx11::string::~string(local_128);
        }
        local_60 = _attr->indent;
      }
      else {
        local_a8 = std::__cxx11::string::find_last_of((string *)&tabPos,(ulong)local_40);
        if ((local_a8 == 0xffffffffffffffff) || (local_a8 == 0)) {
          spliceLine(this,local_60,(string *)&tabPos,local_90 - 1);
          this_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::back(&this->lines);
          std::__cxx11::string::operator+=((string *)this_00,"-");
        }
        else {
          spliceLine(this,local_60,(string *)&tabPos,local_a8);
          pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&tabPos);
          if (*pcVar9 == ' ') {
            std::__cxx11::string::substr((ulong)local_148,(ulong)&tabPos);
            std::__cxx11::string::operator=((string *)&tabPos,local_148);
            std::__cxx11::string::~string(local_148);
          }
        }
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->lines);
        if (sVar7 == 1) {
          local_60 = _attr->indent;
        }
        if (width != 0xffffffffffffffff) {
          local_60 = width + local_60;
        }
      }
    }
  }
  __assert_fail("lines.size() < 1000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jjh13[P]sisl/test/../include/catch/catch.hpp"
                ,0x18f8,"Catch::Text::Text(const std::string &, const TextAttributes &)");
}

Assistant:

Text::Text( std::string const& _str, TextAttributes const& _attr )
    : attr( _attr )
    {
        std::string wrappableChars = " [({.,/|\\-";
        std::size_t indent = _attr.initialIndent != std::string::npos
            ? _attr.initialIndent
            : _attr.indent;
        std::string remainder = _str;

        while( !remainder.empty() ) {
            assert( lines.size() < 1000 );
            std::size_t tabPos = std::string::npos;
            std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
            std::size_t pos = remainder.find_first_of( '\n' );
            if( pos <= width ) {
                width = pos;
            }
            pos = remainder.find_last_of( _attr.tabChar, width );
            if( pos != std::string::npos ) {
                tabPos = pos;
                if( remainder[width] == '\n' )
                    width--;
                remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
            }

            if( width == remainder.size() ) {
                spliceLine( indent, remainder, width );
            }
            else if( remainder[width] == '\n' ) {
                spliceLine( indent, remainder, width );
                if( width <= 1 || remainder.size() != 1 )
                    remainder = remainder.substr( 1 );
                indent = _attr.indent;
            }
            else {
                pos = remainder.find_last_of( wrappableChars, width );
                if( pos != std::string::npos && pos > 0 ) {
                    spliceLine( indent, remainder, pos );
                    if( remainder[0] == ' ' )
                        remainder = remainder.substr( 1 );
                }
                else {
                    spliceLine( indent, remainder, width-1 );
                    lines.back() += "-";
                }
                if( lines.size() == 1 )
                    indent = _attr.indent;
                if( tabPos != std::string::npos )
                    indent += tabPos;
            }
        }
    }